

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void template_setfloat(t_template *x,t_symbol *fieldname,t_word *wp,t_float f,int loud)

{
  int iVar1;
  t_symbol *local_38;
  t_symbol *arraytype;
  int type;
  int onset;
  int loud_local;
  t_float f_local;
  t_word *wp_local;
  t_symbol *fieldname_local;
  t_template *x_local;
  
  type = loud;
  onset = (int)f;
  _loud_local = wp;
  wp_local = (t_word *)fieldname;
  fieldname_local = (t_symbol *)x;
  iVar1 = template_find_field(x,fieldname,(int *)((long)&arraytype + 4),(int *)&arraytype,&local_38)
  ;
  if (iVar1 == 0) {
    if (type != 0) {
      pd_error((void *)0x0,"%s.%s: no such field",fieldname_local->s_next->s_name,wp_local->w_symbol
              );
    }
  }
  else if ((int)arraytype == 0) {
    *(int *)((long)_loud_local + (long)arraytype._4_4_) = onset;
  }
  else if (type != 0) {
    pd_error((void *)0x0,"%s.%s: not a number",fieldname_local->s_next->s_name,wp_local->w_symbol);
  }
  return;
}

Assistant:

void template_setfloat(t_template *x, t_symbol *fieldname, t_word *wp,
    t_float f, int loud)
{
    int onset, type;
    t_symbol *arraytype;
    if (template_find_field(x, fieldname, &onset, &type, &arraytype))
     {
        if (type == DT_FLOAT)
            *(t_float *)(((char *)wp) + onset) = f;
        else if (loud) pd_error(0, "%s.%s: not a number",
            x->t_sym->s_name, fieldname->s_name);
    }
    else if (loud) pd_error(0, "%s.%s: no such field",
        x->t_sym->s_name, fieldname->s_name);
}